

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

char * mwStrdup(char *str,char *file,int line)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (str == (char *)0x0) {
    mwErrors = mwErrors + 1;
    iVar1 = mwFlushR();
    mwFlushingB2 = iVar1 + 1;
    mwFlushingB1 = mwFlushingB2;
    mwFlushing = mwFlushingB2;
    mwFlush();
    pcVar3 = (char *)0x0;
    mwWrite("strdup: <%ld> %s(%d), strdup(NULL) called\n",mwCounter,file,(ulong)(uint)line);
    mwFlush();
  }
  else {
    sVar2 = strlen(str);
    pcVar3 = (char *)mwMalloc(sVar2 + 1,file,line);
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (char *)memcpy(pcVar3,str,sVar2 + 1);
      return pcVar3;
    }
  }
  return pcVar3;
}

Assistant:

char *mwStrdup(const char *str, const char *file, int line)
{
	size_t len;
	char *newstring;

	MW_MUTEX_LOCK();

	if (str == NULL) {
		mwIncErr();
		mwWrite("strdup: <%ld> %s(%d), strdup(NULL) called\n",
				mwCounter, file, line);
		FLUSH();
		MW_MUTEX_UNLOCK();
		return NULL;
	}

	len = strlen(str) + 1;
	newstring = (char *) mwMalloc(len, file, line);
	if (newstring != NULL) {
		memcpy(newstring, str, len);
	}
	MW_MUTEX_UNLOCK();
	return newstring;
}